

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O2

void sylvan_set_limits(size_t memorycap,int table_ratio,int initial_ratio)

{
  ulong uVar1;
  long lVar2;
  char *__ptr;
  size_t sVar3;
  ulong uVar4;
  size_t sVar6;
  size_t sStack_30;
  long lVar5;
  
  if (table_ratio - 0xbU < 0xffffffeb) {
    __ptr = "sylvan_set_limits: table_ratio unreasonable (between -10 and 10)\n";
    sStack_30 = 0x41;
  }
  else {
    sVar6 = 1;
    sVar3 = 1L << ((ulong)(byte)-(char)table_ratio & 0x3f);
    if (0 < table_ratio) {
      sVar3 = sVar6;
      sVar6 = 1L << ((ulong)(uint)table_ratio & 0x3f);
    }
    lVar2 = 0x18L << ((ulong)(uint)table_ratio & 0x3f);
    if (table_ratio < 1) {
      lVar2 = 0x18;
    }
    lVar5 = 0x24L << ((ulong)(byte)-(char)table_ratio & 0x3f);
    if (0 < table_ratio) {
      lVar5 = 0x24;
    }
    uVar4 = lVar5 + lVar2;
    if (memorycap < uVar4) {
      fwrite("sylvan_set_limits: memory cap incompatible with requested table ratio\n",0x46,1,
             _stderr);
    }
    for (; (uVar4 = uVar4 * 2, uVar4 < memorycap && (sVar6 >> 0x2a == 0)); sVar6 = sVar6 * 2) {
      sVar3 = sVar3 * 2;
    }
    uVar4 = sVar3;
    uVar1 = sVar6;
    if (-1 < initial_ratio) {
      for (; ((0 < initial_ratio && (0x1000 < uVar1)) && (0x1000 < uVar4)); uVar4 = uVar4 >> 1) {
        initial_ratio = initial_ratio + -1;
        uVar1 = uVar1 >> 1;
      }
      table_min = uVar1;
      table_max = sVar6;
      cache_min = uVar4;
      cache_max = sVar3;
      return;
    }
    __ptr = "sylvan_set_limits: initial_ratio unreasonable (may not be negative)\n";
    sStack_30 = 0x44;
  }
  fwrite(__ptr,sStack_30,1,_stderr);
  exit(1);
}

Assistant:

void
sylvan_set_limits(size_t memorycap, int table_ratio, int initial_ratio)
{
    /* This method ONLY limits the "unique nodes table" and the "operation cache" which are the main
     * datastructures of Sylvan.
     *
     * Suggested limits:
     * - memorycap to whatever you want at most, in bytes.
     * - table_ratio to a number between -3 (8x bigger cache) and 3 (8x bigger nodes table)
     * - inital_ratio to something like 10 (start with 1024x smaller tables initially)
     */
    if (table_ratio < -10 || table_ratio > 10) {
        fprintf(stderr, "sylvan_set_limits: table_ratio unreasonable (between -10 and 10)\n");
        exit(1);
    }

    size_t max_t = 1;
    size_t max_c = 1;
    if (table_ratio > 0) {
        max_t <<= table_ratio;
    } else {
        max_c <<= -table_ratio;
    }

    size_t cur = max_t * 24 + max_c * 36;
    if (cur > memorycap) {
        fprintf(stderr, "sylvan_set_limits: memory cap incompatible with requested table ratio\n");
    }

    while (2*cur < memorycap && max_t < 0x0000040000000000) {
        max_t *= 2;
        max_c *= 2;
        cur *= 2;
    }

    if (initial_ratio < 0) {
        fprintf(stderr, "sylvan_set_limits: initial_ratio unreasonable (may not be negative)\n");
        exit(1);
    }

    size_t min_t = max_t, min_c = max_c;
    while (initial_ratio > 0 && min_t > 0x1000 && min_c > 0x1000) {
        min_t >>= 1;
        min_c >>= 1;
        initial_ratio--;
    }

    table_min = min_t;
    table_max = max_t;
    cache_min = min_c;
    cache_max = max_c;
}